

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.hpp
# Opt level: O3

void apply_sharpen(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,float sharpness_val)

{
  pointer pMVar1;
  ostream *poVar2;
  Mat *pMVar3;
  Mat *pMVar4;
  Mat *img;
  pointer pMVar5;
  Mat sharpeningKernel;
  Mat *local_1b8;
  Mat *local_1b0;
  Mat *local_1a8;
  uchar *local_1a0;
  Mat *local_198;
  float local_18c;
  MatConstIterator local_188;
  double local_160;
  undefined8 local_158;
  uint local_150 [2];
  pointer local_148;
  undefined8 local_140;
  undefined4 local_f0 [2];
  pointer local_e8;
  undefined8 local_e0;
  Mat local_90 [96];
  
  local_18c = sharpness_val;
  cv::Mat::Mat((Mat *)local_f0,3,3,6);
  cv::MatConstIterator::MatConstIterator(&local_188,(Mat *)local_f0);
  local_188.ptr[0] = '\0';
  local_188.ptr[1] = '\0';
  local_188.ptr[2] = '\0';
  local_188.ptr[3] = '\0';
  local_188.ptr[4] = '\0';
  local_188.ptr[5] = '\0';
  local_188.ptr[6] = '\0';
  local_188.ptr[7] = '\0';
  local_1b8 = (Mat *)CONCAT44(local_188.m._4_4_,local_188.m._0_4_);
  if (local_1b8 == (Mat *)0x0) {
    local_1b8 = (Mat *)0x0;
    local_1a8 = (Mat *)local_188.ptr;
  }
  else {
    local_1a8 = (Mat *)(local_188.ptr + local_188.elemSize);
    if (local_188.sliceEnd <= (Mat *)(local_188.ptr + local_188.elemSize)) {
      cv::MatConstIterator::seek((long)&local_188,true);
      local_1b8 = (Mat *)CONCAT44(local_188.m._4_4_,local_188.m._0_4_);
      local_1a8 = (Mat *)local_188.ptr;
    }
  }
  local_1b0 = (Mat *)local_188.elemSize;
  local_1a0 = local_188.sliceStart;
  local_198 = (Mat *)local_188.sliceEnd;
  *(undefined8 *)local_1a8 = 0;
  if (local_1b8 == (Mat *)0x0) {
LAB_0010be9a:
    *(undefined8 *)local_1a8 = 0;
LAB_0010bea1:
    local_160 = (double)local_18c;
    *(undefined8 *)local_1a8 = 0;
LAB_0010beb7:
    *(undefined8 *)local_1a8 = 0;
LAB_0010bebe:
    *(undefined8 *)local_1a8 = 0;
LAB_0010bec5:
    pMVar3 = (Mat *)0x0;
    pMVar4 = local_1a8;
  }
  else {
    pMVar3 = (Mat *)(local_188.elemSize + (long)local_1a8);
    if (pMVar3 < local_188.sliceEnd) {
      *(undefined8 *)pMVar3 = 0;
    }
    else {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0;
      pMVar3 = local_1a8;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010be9a;
    }
    local_1a8 = local_1b0 + (long)pMVar3;
    if (local_1a8 < local_198) {
      *(undefined8 *)local_1a8 = 0;
    }
    else {
      local_1a8 = pMVar3;
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010bea1;
    }
    pMVar3 = local_1b0 + (long)local_1a8;
    if (local_198 <= pMVar3) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      local_160 = (double)local_18c;
      *(double *)local_1a8 = local_160;
      pMVar3 = local_1a8;
      if (local_1b8 != (Mat *)0x0) goto LAB_0010c070;
      *(undefined8 *)local_1a8 = 0;
LAB_0010c4f5:
      *(undefined8 *)local_1a8 = 0;
      goto LAB_0010bec5;
    }
    local_160 = (double)local_18c;
    *(double *)pMVar3 = local_160;
LAB_0010c070:
    local_1a8 = local_1b0 + (long)pMVar3;
    if (local_1a8 < local_198) {
      *(undefined8 *)local_1a8 = 0;
    }
    else {
      local_1a8 = pMVar3;
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010beb7;
    }
    pMVar3 = local_1b0 + (long)local_1a8;
    if (pMVar3 < local_198) {
      *(undefined8 *)pMVar3 = 0;
    }
    else {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0;
      pMVar3 = local_1a8;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010c4f5;
    }
    local_1a8 = local_1b0 + (long)pMVar3;
    if (local_1a8 < local_198) {
      *(undefined8 *)local_1a8 = 0;
    }
    else {
      local_1a8 = pMVar3;
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010bebe;
    }
    pMVar3 = local_1b0 + (long)local_1a8;
    if (pMVar3 < local_198) {
      *(undefined8 *)pMVar3 = 0;
      local_1a8 = pMVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010bec5;
    }
    pMVar3 = local_1b8;
    pMVar4 = local_1b0 + (long)local_1a8;
    if (local_198 <= local_1b0 + (long)local_1a8) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar3 = local_1b8;
      pMVar4 = local_1a8;
    }
  }
  local_1a8 = pMVar4;
  cv::Mat::Mat((Mat *)local_150);
  local_150[0] = local_150[0] & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)local_150,pMVar3);
  cv::Mat::Mat(local_90,(Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_f0);
  if ((local_18c == 1.0) && (!NAN(local_18c))) goto LAB_0010c134;
  cv::Mat::Mat((Mat *)local_f0,3,3,6);
  cv::MatConstIterator::MatConstIterator(&local_188,(Mat *)local_f0);
  local_188.ptr[0] = '\0';
  local_188.ptr[1] = '\0';
  local_188.ptr[2] = '\0';
  local_188.ptr[3] = '\0';
  local_188.ptr[4] = '\0';
  local_188.ptr[5] = '\0';
  local_188.ptr[6] = 0xf0;
  local_188.ptr[7] = 0xbf;
  pMVar3 = (Mat *)CONCAT44(local_188.m._4_4_,local_188.m._0_4_);
  if (pMVar3 == (Mat *)0x0) {
    pMVar3 = (Mat *)0x0;
    pMVar4 = (Mat *)local_188.ptr;
  }
  else {
    pMVar4 = (Mat *)(local_188.ptr + local_188.elemSize);
    if (local_188.sliceEnd <= (Mat *)(local_188.ptr + local_188.elemSize)) {
      cv::MatConstIterator::seek((long)&local_188,true);
      pMVar3 = (Mat *)CONCAT44(local_188.m._4_4_,local_188.m._0_4_);
      pMVar4 = (Mat *)local_188.ptr;
    }
  }
  local_1b0 = (Mat *)local_188.elemSize;
  local_1a0 = local_188.sliceStart;
  local_198 = (Mat *)local_188.sliceEnd;
  *(undefined8 *)pMVar4 = 0xbff0000000000000;
  local_1b8 = pMVar3;
  local_1a8 = pMVar4;
  if (pMVar3 == (Mat *)0x0) {
LAB_0010c0d4:
    *(undefined8 *)local_1a8 = 0xbff0000000000000;
LAB_0010c0d7:
    *(undefined8 *)local_1a8 = 0xbff0000000000000;
LAB_0010c0da:
    *(undefined8 *)local_1a8 = 0xbff0000000000000;
LAB_0010c0dd:
    *(undefined8 *)local_1a8 = 0xbff0000000000000;
LAB_0010c0e0:
    pMVar3 = (Mat *)0x0;
    pMVar4 = local_1a8;
  }
  else {
    pMVar4 = (Mat *)(local_188.elemSize + (long)pMVar4);
    if (pMVar4 < local_188.sliceEnd) {
      *(undefined8 *)pMVar4 = 0xbff0000000000000;
    }
    else {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
      pMVar4 = local_1a8;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010c0d4;
    }
    local_1a8 = local_1b0 + (long)pMVar4;
    if (local_1a8 < local_198) {
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
    }
    else {
      local_1a8 = pMVar4;
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010c0d7;
    }
    pMVar3 = local_1b0 + (long)local_1a8;
    if (local_198 <= pMVar3) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(double *)local_1a8 = local_160;
      pMVar3 = local_1a8;
      if (local_1b8 != (Mat *)0x0) goto LAB_0010c3ac;
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
LAB_0010c5a5:
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
      goto LAB_0010c0e0;
    }
    *(double *)pMVar3 = local_160;
LAB_0010c3ac:
    local_1a8 = local_1b0 + (long)pMVar3;
    if (local_1a8 < local_198) {
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
    }
    else {
      local_1a8 = pMVar3;
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010c0da;
    }
    pMVar3 = local_1b0 + (long)local_1a8;
    if (pMVar3 < local_198) {
      *(undefined8 *)pMVar3 = 0xbff0000000000000;
    }
    else {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
      pMVar3 = local_1a8;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010c5a5;
    }
    local_1a8 = local_1b0 + (long)pMVar3;
    if (local_1a8 < local_198) {
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
    }
    else {
      local_1a8 = pMVar3;
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010c0dd;
    }
    pMVar3 = local_1b0 + (long)local_1a8;
    if (pMVar3 < local_198) {
      *(undefined8 *)pMVar3 = 0xbff0000000000000;
      local_1a8 = pMVar3;
    }
    else {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      *(undefined8 *)local_1a8 = 0xbff0000000000000;
      if (local_1b8 == (Mat *)0x0) goto LAB_0010c0e0;
    }
    pMVar3 = local_1b8;
    pMVar4 = local_1b0 + (long)local_1a8;
    if (local_198 <= local_1b0 + (long)local_1a8) {
      cv::MatConstIterator::seek((long)&local_1b8,true);
      pMVar3 = local_1b8;
      pMVar4 = local_1a8;
    }
  }
  local_1a8 = pMVar4;
  cv::Mat::Mat((Mat *)local_150);
  local_150[0] = local_150[0] & 0xfffff000 | 6;
  cv::Mat_<double>::operator=((Mat_<double> *)local_150,pMVar3);
  cv::Mat::operator=(local_90,(Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_150);
  cv::Mat::~Mat((Mat *)local_f0);
LAB_0010c134:
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::blue_abi_cxx11_,DAT_00158610);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Changing Sharpness : ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,color::reset_abi_cxx11_,DAT_00158670);
  pMVar5 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (image_list->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar5 != pMVar1) {
    do {
      local_140 = 0;
      local_150[0] = 0x1010000;
      local_e0 = 0;
      local_f0[0] = 0x2010000;
      local_188.ptr = (uchar *)0x0;
      local_188.m._0_4_ = 0x1010000;
      local_188.elemSize = (size_t)local_90;
      local_158 = 0xffffffffffffffff;
      local_148 = pMVar5;
      local_e8 = pMVar5;
      cv::filter2D(0,local_150,local_f0,0xffffffff,&local_188,&local_158,4);
      pMVar5 = pMVar5 + 0x60;
    } while (pMVar5 != pMVar1);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,color::green_abi_cxx11_,DAT_001585f0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Done",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,color::reset_abi_cxx11_,DAT_00158670);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void apply_sharpen(std::vector<cv::Mat> &image_list, float sharpness_val) {
   Mat sharpeningKernel = (Mat_<double>(3,3) << 0, 0, 0, 0, sharpness_val, 0, 0, 0, 0);
   if(sharpness_val != 1)
   {
      sharpeningKernel = (Mat_<double>(3,3) << -1, -1, -1, -1, sharpness_val, -1, -1, -1, -1);
   }
   std::cout << color::blue << "Changing Sharpness : " << color::reset;
   for(auto &img: image_list) {
      filter2D(img, img, -1, sharpeningKernel);
   }
   std::cout << color::green << "Done" <<color::reset<<std::endl;
}